

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
glcts::anon_unknown_0::BasicAtomicCase3::RunIteration
          (BasicAtomicCase3 *this,uvec3 *param_1,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  long length;
  uint uVar1;
  bool bVar2;
  GLuint GVar3;
  GLint location;
  ostream *poVar4;
  void *pvVar5;
  bool *compile_error;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  GLuint num_groups [3];
  GLuint values [8];
  string local_1d8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [376];
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nlayout(local_size_x = ",0x17);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", local_size_y = ",0x11);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", local_size_z = ",0x11);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,") in;\nlayout(std430, binding = 0) buffer Output {\n  uint g_uint_out[",0x44);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"];\n  int g_int_out[",0x13);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"];\n};\nshared uint g_shared_uint[",0x20);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"];\nshared int g_shared_int[",0x1b);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "];\nuniform uint g_uint_value[8];\nvoid main() {\n  atomicExchange(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[0]);\n  atomicMin(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[1]);\n  atomicMax(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[2]);\n  atomicAnd(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[3]);\n  atomicOr(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[4]);\n  atomicXor(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[5]);\n  atomicCompSwap(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[6], g_uint_value[7]);\n\n  atomicExchange(g_shared_int[gl_LocalInvocationIndex], 3);\n  atomicMin(g_shared_int[gl_LocalInvocationIndex], 1);\n  atomicMax(g_shared_int[gl_LocalInvocationIndex], 2);\n  atomicAnd(g_shared_int[gl_LocalInvocationIndex], 0x1);\n  if (g_uint_value[1] > 0u) {\n    atomicOr(g_shared_int[gl_LocalInvocationIndex], 0x3);\n    atomicXor(g_shared_int[gl_LocalInvocationIndex], 0x1);\n    atomicCompSwap(g_shared_int[gl_LocalInvocationIndex], 0x2, 0x7);\n  }\n\n  g_uint_out[gl_LocalInvocationIndex] = g_shared_uint[gl_LocalInvocationIndex];\n  g_int_out[gl_LocalInvocationIndex] = g_shared_int[gl_LocalInvocationIndex];\n}"
             ,0x493);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_1d8);
  this->m_program = GVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    GVar3 = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,GVar3);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar2) {
    uVar7 = param_1->m_data[1] * param_1->m_data[0] * param_1->m_data[2];
    GVar3 = this->m_storage_buffer;
    if (GVar3 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
      GVar3 = this->m_storage_buffer;
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar3);
    uVar8 = (ulong)uVar7;
    length = uVar8 * 4;
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,uVar8 * 8,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    local_1a8._0_8_ = (_func_int **)0x100000003;
    local_1a8._8_8_ = 0x700000002;
    local_1b8 = 0x100000003;
    uStack_1b0 = 0x100000002;
    location = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_uint_value");
    glu::CallLogWrapper::glUniform1uiv(this_00,location,8,(GLuint *)&local_1b8);
    if (dispatch_indirect) {
      local_1d8._M_dataplus._M_p = &DAT_100000001;
      local_1d8._M_string_length._0_4_ = 1;
      GVar3 = this->m_dispatch_buffer;
      if (GVar3 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
        GVar3 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar3);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,&local_1d8,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    }
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pvVar5 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,length,1);
    if (uVar7 == 0) {
      bVar2 = true;
    }
    else {
      bVar2 = true;
      uVar6 = 0;
      do {
        uVar1 = *(uint *)((long)pvVar5 + uVar6 * 4);
        if (uVar1 != 7) {
          bVar2 = false;
          anon_unknown_0::Output
                    ("uData at index %d is %d should be %d.\n",uVar6 & 0xffffffff,(ulong)uVar1,7);
        }
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    pvVar5 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,length,length,1);
    if (0 < (int)uVar7) {
      uVar6 = 0;
      do {
        uVar7 = *(uint *)((long)pvVar5 + uVar6 * 4);
        if (uVar7 != 7) {
          bVar2 = false;
          anon_unknown_0::Output
                    ("iData at index %d is %d should be %d.\n",uVar6 & 0xffffffff,(ulong)uVar7,7);
        }
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RunIteration(const uvec3& local_size, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLuint kBufferSize = local_size.x() * local_size.y() * local_size.z();

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize * 2, NULL, GL_DYNAMIC_DRAW);

		glUseProgram(m_program);
		GLuint values[8] = { 3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u };
		glUniform1uiv(glGetUniformLocation(m_program, "g_uint_value"), 8, values);
		if (dispatch_indirect)
		{
			const GLuint num_groups[3] = { 1, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool	ret = true;
		GLuint* udata;
		udata = static_cast<GLuint*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kBufferSize, GL_MAP_READ_BIT));
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (udata[i] != 7)
			{
				Output("uData at index %d is %d should be %d.\n", i, udata[i], 7);
				ret = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		GLint* idata;
		idata = static_cast<GLint*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize,
													 sizeof(GLint) * kBufferSize, GL_MAP_READ_BIT));
		for (GLint i = 0; i < static_cast<GLint>(kBufferSize); ++i)
		{
			if (idata[i] != 7)
			{
				Output("iData at index %d is %d should be %d.\n", i, idata[i], 7);
				ret = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		return ret;
	}